

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,block_statement *s)

{
  bool bVar1;
  statement_list *this_00;
  type s_00;
  completion local_a8;
  reference local_68;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *bs;
  const_iterator __end2;
  const_iterator __begin2;
  statement_list *__range2;
  undefined1 local_30 [8];
  strict_mode_scope sms;
  block_statement *s_local;
  impl *this_local;
  completion *c;
  
  sms._8_8_ = s;
  bVar1 = block_statement::strict_mode(s);
  strict_mode_scope::strict_mode_scope((strict_mode_scope *)local_30,this,bVar1);
  completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
  this_00 = block_statement::l((block_statement *)sms._8_8_);
  __end2 = std::
           vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ::begin(this_00);
  bs = (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
       std::
       vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
                                     *)&bs), bVar1) {
    local_68 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
               ::operator*(&__end2);
    s_00 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                     (local_68);
    eval(&local_a8,this,s_00);
    completion::operator=(__return_storage_ptr__,&local_a8);
    completion::~completion(&local_a8);
    bVar1 = completion::operator_cast_to_bool(__return_storage_ptr__);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_*,_std::vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>_>
    ::operator++(&__end2);
  }
  strict_mode_scope::~strict_mode_scope((strict_mode_scope *)local_30);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const block_statement& s) {
        strict_mode_scope sms{*this, s.strict_mode()};
        completion c{};
        for (const auto& bs: s.l()) {
            c = eval(*bs);
            if (c) break;
        }
        return c;
    }